

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

int duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>::Operation<long,int>
              (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  int result_value;
  VectorDecimalCastData *data;
  undefined6 in_stack_ffffffffffffff78;
  uint8_t in_stack_ffffffffffffff7e;
  uint8_t in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int32_t *in_stack_ffffffffffffff88;
  allocator *mask_00;
  string *in_stack_ffffffffffffff90;
  allocator local_59;
  string local_58 [36];
  int local_34;
  int local_4;
  
  bVar1 = TryCastToDecimal::Operation<long,int>
                    ((int64_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     (CastParameters *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                     ,in_stack_ffffffffffffff7f,in_stack_ffffffffffffff7e);
  if (bVar1) {
    local_4 = local_34;
  }
  else {
    mask_00 = &local_59;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_58,"Failed to cast decimal value",mask_00);
    local_4 = HandleVectorCastError::Operation<int>
                        (in_stack_ffffffffffffff90,(ValidityMask *)mask_00,
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (VectorTryCastData *)
                         CONCAT17(in_stack_ffffffffffffff7f,
                                  CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
    ::std::__cxx11::string::~string(local_58);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return local_4;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorDecimalCastData *>(dataptr);
		RESULT_TYPE result_value;
		if (!OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, result_value, data->vector_cast_data.parameters,
		                                                     data->width, data->scale)) {
			return HandleVectorCastError::Operation<RESULT_TYPE>("Failed to cast decimal value", mask, idx,
			                                                     data->vector_cast_data);
		}
		return result_value;
	}